

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void renameTestSchema(Parse *pParse,char *zDb,int bTemp,char *zWhen,int bNoDQS)

{
  int bNoDQS_local;
  char *zWhen_local;
  int bTemp_local;
  char *zDb_local;
  Parse *pParse_local;
  
  pParse->colNamesSet = '\x01';
  sqlite3NestedParse(pParse,
                     "SELECT 1 FROM \"%w\".sqlite_master WHERE name NOT LIKE \'sqliteX_%%\' ESCAPE \'X\' AND sql NOT LIKE \'create virtual%%\' AND sqlite_rename_test(%Q, sql, type, name, %d, %Q, %d)=NULL "
                     ,zDb,zDb,(ulong)(uint)bTemp,zWhen,bNoDQS);
  if (bTemp == 0) {
    sqlite3NestedParse(pParse,
                       "SELECT 1 FROM temp.sqlite_master WHERE name NOT LIKE \'sqliteX_%%\' ESCAPE \'X\' AND sql NOT LIKE \'create virtual%%\' AND sqlite_rename_test(%Q, sql, type, name, 1, %Q, %d)=NULL "
                       ,zDb,zWhen,(ulong)(uint)bNoDQS);
  }
  return;
}

Assistant:

static void renameTestSchema(
  Parse *pParse,                  /* Parse context */
  const char *zDb,                /* Name of db to verify schema of */
  int bTemp,                      /* True if this is the temp db */
  const char *zWhen,              /* "when" part of error message */
  int bNoDQS                      /* Do not allow DQS in the schema */
){
  pParse->colNamesSet = 1;
  sqlite3NestedParse(pParse,
      "SELECT 1 "
      "FROM \"%w\"." LEGACY_SCHEMA_TABLE " "
      "WHERE name NOT LIKE 'sqliteX_%%' ESCAPE 'X'"
      " AND sql NOT LIKE 'create virtual%%'"
      " AND sqlite_rename_test(%Q, sql, type, name, %d, %Q, %d)=NULL ",
      zDb,
      zDb, bTemp, zWhen, bNoDQS
  );

  if( bTemp==0 ){
    sqlite3NestedParse(pParse,
        "SELECT 1 "
        "FROM temp." LEGACY_SCHEMA_TABLE " "
        "WHERE name NOT LIKE 'sqliteX_%%' ESCAPE 'X'"
        " AND sql NOT LIKE 'create virtual%%'"
        " AND sqlite_rename_test(%Q, sql, type, name, 1, %Q, %d)=NULL ",
        zDb, zWhen, bNoDQS
    );
  }
}